

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O3

plt_lib plt_get_lib(plt_ctx ctx,char *name)

{
  link_map *plVar1;
  plt_ctx ctx_00;
  long lVar2;
  plt_selector pVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 **ppuVar8;
  link_map *lib;
  plt_lib plVar9;
  bool bVar10;
  undefined1 *local_58;
  plt_ctx local_50;
  size_t local_48;
  size_t len;
  char *local_38;
  char *val;
  
  ppuVar8 = &local_58;
  if (name == (char *)0x0) {
    plVar9 = ctx->r_map;
  }
  else {
    local_38 = (char *)0x0;
    pVar3 = plt_get_selector(name,&local_38);
    pcVar6 = local_38;
    sVar5 = strlen(local_38);
    if (*pcVar6 == 'c') {
      bVar10 = pcVar6[1] == '\0';
    }
    else {
      bVar10 = false;
    }
    lib = ctx->r_map;
    if (lib != (link_map *)0x0) {
      local_48 = sVar5 + 8;
      len = sVar5 + 0x17 & 0xfffffffffffffff0;
      local_50 = ctx;
      do {
        pcVar6 = local_38;
        if (pVar3 == PLT_SEL_LIB) {
          plVar1 = ctx->r_map;
          *(undefined8 *)((long)ppuVar8 + -8) = 0x102ba6;
          pcVar6 = get_lib_name((plt_ctx)plVar1,lib);
          sVar5 = local_48;
          if (bVar10) {
            *(undefined8 *)((long)ppuVar8 + -8) = 0x102bbd;
            pcVar7 = strstr(pcVar6,"/libc.so");
            if (pcVar7 != (char *)0x0) {
              return lib;
            }
            *(undefined8 *)((long)ppuVar8 + -8) = 0x102bd5;
            pcVar6 = strstr(pcVar6,"/musl.so");
          }
          else {
            lVar2 = -len;
            pcVar7 = (char *)((long)ppuVar8 + lVar2);
            local_58 = (undefined1 *)ppuVar8;
            builtin_strncpy((char *)((long)ppuVar8 + lVar2 + -8),"),\x10",4);
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            snprintf(pcVar7,sVar5,"/lib%s.so");
            builtin_strncpy((char *)((long)ppuVar8 + lVar2 + -8),"7,\x10",4);
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            pcVar6 = strstr(pcVar6,pcVar7);
            ppuVar8 = (undefined1 **)local_58;
            ctx = local_50;
          }
joined_r0x00102c42:
          if (pcVar6 != (char *)0x0) {
            return lib;
          }
        }
        else if ((pVar3 & ~PLT_SEL_FILE) == PLT_SEL_NONE) {
          plVar1 = ctx->r_map;
          *(undefined8 *)((long)ppuVar8 + -8) = 0x102c52;
          pcVar7 = get_lib_name((plt_ctx)plVar1,lib);
          pcVar6 = local_38;
          *(undefined8 *)((long)ppuVar8 + -8) = 0x102c5e;
          iVar4 = strcmp(pcVar6,pcVar7);
          if (iVar4 == 0) {
            return lib;
          }
        }
        else if (pVar3 == PLT_SEL_SYM) {
          ctx_00 = (plt_ctx)lib->l_addr;
          plVar9 = (plt_lib)lib->l_ld;
          *(undefined8 *)((long)ppuVar8 + -8) = 0x102bf8;
          pcVar6 = (char *)get_offsets(ctx_00,plVar9,pcVar6,(plt_offset **)0x0);
          goto joined_r0x00102c42;
        }
        lib = lib->l_next;
      } while (lib != (link_map *)0x0);
    }
    plVar9 = (plt_lib)0x0;
  }
  return plVar9;
}

Assistant:

plt_lib plt_get_lib(plt_ctx ctx, const char *name)
{
    if (!name)
        return ctx->r_map;

    const char *val = NULL;
    enum plt_selector sel = plt_get_selector(name, &val);
    size_t val_len = strlen(val);
    int libc = !strcmp(val, "c");

    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        if (sel == PLT_SEL_LIB) {
            const char *libname = get_lib_name(ctx, lm);
            if (libc) {
                if (strstr(libname, "/libc.so")
                 || strstr(libname, "/musl.so"))
                    return lm;
            } else {
                size_t len = val_len + 8;
                char pattern[len];
                snprintf(pattern, len, "/lib%s.so", val);
                if (strstr(libname, pattern))
                    return lm;
            }
        } else if (sel == PLT_SEL_NONE || sel == PLT_SEL_FILE) {
            const char *libname = get_lib_name(ctx, lm);
            if (!strcmp(val, libname))
                return lm;
        } else if (sel == PLT_SEL_SYM) {
            if (get_offsets(ctx, lm, val, NULL) > 0)
                return lm;
        }
    }
    return NULL;
}